

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

void __thiscall cmCPackIFWPackage::DefaultConfiguration(cmCPackIFWPackage *this)

{
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->DisplayName)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->Description)._M_t);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Version,0,(char *)(this->Version)._M_string_length,0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->ReleaseDate,0,(char *)(this->ReleaseDate)._M_string_length,0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Script,0,(char *)(this->Script)._M_string_length,0x5f2b3e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->Licenses,
                    (this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->UserInterfaces,
                    (this->UserInterfaces).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->Translations,
                    (this->Translations).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::_M_replace
            ((ulong)&this->SortingPriority,0,(char *)(this->SortingPriority)._M_string_length,
             0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->UpdateText,0,(char *)(this->UpdateText)._M_string_length,0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Default,0,(char *)(this->Default)._M_string_length,0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Essential,0,(char *)(this->Essential)._M_string_length,0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Virtual,0,(char *)(this->Virtual)._M_string_length,0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->ForcedInstallation,0,(char *)(this->ForcedInstallation)._M_string_length,
             0x5f2b3e);
  std::__cxx11::string::_M_replace
            ((ulong)&this->RequiresAdminRights,0,
             (char *)(this->RequiresAdminRights)._M_string_length,0x5f2b3e);
  return;
}

Assistant:

void cmCPackIFWPackage::DefaultConfiguration()
{
  this->DisplayName.clear();
  this->Description.clear();
  this->Version = "";
  this->ReleaseDate = "";
  this->Script = "";
  this->Licenses.clear();
  this->UserInterfaces.clear();
  this->Translations.clear();
  this->SortingPriority = "";
  this->UpdateText = "";
  this->Default = "";
  this->Essential = "";
  this->Virtual = "";
  this->ForcedInstallation = "";
  this->RequiresAdminRights = "";
}